

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

xmlSchemaTypePtr xmlSchemaGetBuiltInListSimpleTypeItemType(xmlSchemaTypePtr type)

{
  int iVar1;
  xmlSchemaTypePtr type_local;
  
  if ((type == (xmlSchemaTypePtr)0x0) || (type->type != XML_SCHEMA_TYPE_BASIC)) {
    type_local = (xmlSchemaTypePtr)0x0;
  }
  else {
    iVar1 = type->builtInType;
    if (iVar1 == 0x13) {
      type_local = xmlSchemaTypeNmtokenDef;
    }
    else if (iVar1 == 0x19) {
      type_local = xmlSchemaTypeIdrefDef;
    }
    else if (iVar1 == 0x1b) {
      type_local = xmlSchemaTypeEntityDef;
    }
    else {
      type_local = (xmlSchemaTypePtr)0x0;
    }
  }
  return type_local;
}

Assistant:

xmlSchemaTypePtr
xmlSchemaGetBuiltInListSimpleTypeItemType(xmlSchemaTypePtr type)
{
    if ((type == NULL) || (type->type != XML_SCHEMA_TYPE_BASIC))
	return (NULL);
    switch (type->builtInType) {
	case XML_SCHEMAS_NMTOKENS:
	    return (xmlSchemaTypeNmtokenDef );
	case XML_SCHEMAS_IDREFS:
	    return (xmlSchemaTypeIdrefDef);
	case XML_SCHEMAS_ENTITIES:
	    return (xmlSchemaTypeEntityDef);
	default:
	    return (NULL);
    }
}